

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O1

void __thiscall QPropertyBindingPrivate::clearDependencyObservers(QPropertyBindingPrivate *this)

{
  vector<QPropertyObserver,_std::allocator<QPropertyObserver>_> *pvVar1;
  pointer pQVar2;
  pointer pQVar3;
  ulong uVar4;
  ulong uVar5;
  pointer this_00;
  ObserverArray *pOVar6;
  long in_FS_OFFSET;
  QPropertyObserverPointer local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dependencyObserverCount != 0) {
    pOVar6 = &this->inlineDependencyObservers;
    uVar5 = 0;
    do {
      local_38.ptr = pOVar6->_M_elems;
      QPropertyObserverPointer::unlink_common(&local_38);
      uVar5 = uVar5 + 1;
      uVar4 = this->dependencyObserverCount;
      if (3 < uVar4) {
        uVar4 = 4;
      }
      pOVar6 = (ObserverArray *)(pOVar6->_M_elems + 1);
    } while (uVar5 < uVar4);
  }
  pvVar1 = (this->heapObservers)._M_t.
           super___uniq_ptr_impl<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_*,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
           .
           super__Head_base<0UL,_std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_*,_false>
           ._M_head_impl;
  if (pvVar1 != (vector<QPropertyObserver,_std::allocator<QPropertyObserver>_> *)0x0) {
    pQVar2 = *(pointer *)
              &(pvVar1->super__Vector_base<QPropertyObserver,_std::allocator<QPropertyObserver>_>).
               _M_impl;
    pQVar3 = *(pointer *)
              ((long)&(pvVar1->
                      super__Vector_base<QPropertyObserver,_std::allocator<QPropertyObserver>_>).
                      _M_impl + 8);
    this_00 = pQVar2;
    if (pQVar3 != pQVar2) {
      do {
        QPropertyObserver::~QPropertyObserver(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pQVar3);
      *(pointer *)
       ((long)&(pvVar1->super__Vector_base<QPropertyObserver,_std::allocator<QPropertyObserver>_>).
               _M_impl + 8) = pQVar2;
    }
  }
  this->dependencyObserverCount = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyBindingPrivate::clearDependencyObservers() {
    for (size_t i = 0; i < qMin(dependencyObserverCount, inlineDependencyObservers.size()); ++i) {
        QPropertyObserverPointer p{&inlineDependencyObservers[i]};
        p.unlink_fast();
    }
    if (heapObservers)
        heapObservers->clear();
    dependencyObserverCount = 0;
}